

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_classes(CHAR_DATA *ch,char *argument)

{
  pointer prVar1;
  CClass *pCVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char buf [4608];
  char acStack_1238 [4616];
  
  if (race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
      super__Vector_impl_data._M_start[1].name != (char *)0x0) {
    prVar1 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
    lVar4 = 0x4a0002;
    lVar6 = 1;
    do {
      if (prVar1->pc_race != true) break;
      sprintf(acStack_1238,"\n\r%s:\n\r");
      send_to_char(acStack_1238,ch);
      lVar5 = 0;
      do {
        if (*(short *)(lVar4 + lVar5 * 2) == 1) {
          pCVar2 = CClass::GetClass((int)lVar5 + 1);
          pcVar3 = RString::operator_cast_to_char_(&pCVar2->name);
          sprintf(acStack_1238,"%s ",pcVar3);
          send_to_char(acStack_1238,ch);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0xb);
      lVar6 = lVar6 + 1;
      prVar1 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
               super__Vector_impl_data._M_start + lVar6;
      lVar4 = lVar4 + 0x88;
    } while (race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
             super__Vector_impl_data._M_start[lVar6].name != (char *)0x0);
  }
  send_to_char("\n\r",ch);
  return;
}

Assistant:

void do_classes(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	int iRace;
	int iClass;

	for (iRace = 1; race_table[iRace].name != nullptr; iRace++)
	{
		if (!race_table[iRace].pc_race)
			break;

		sprintf(buf, "\n\r%s:\n\r", race_table[iRace].name);
		send_to_char(buf, ch);

		for (iClass = 1; iClass < MAX_CLASS; iClass++)
		{
			if (pc_race_table[iRace].classes[iClass] == 1)
			{
				sprintf(buf, "%s ", (RSTR)CClass::GetClass(iClass)->name);
				send_to_char(buf, ch);
			}
		}
	}

	send_to_char("\n\r", ch);
}